

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader14.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::NodeLoader14::begin__instance_node(NodeLoader14 *this)

{
  instance_node__AttributeData *in_stack_00000208;
  NodeLoader14 *in_stack_00000210;
  
  begin__instance_node(in_stack_00000210,in_stack_00000208);
  return;
}

Assistant:

bool NodeLoader14::begin__instance_node( const COLLADASaxFWL14::instance_node__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__instance_node(attributeData));
COLLADASaxFWL::instance_node__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL14::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_node(attrData);
}